

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# versionbits_tests.cpp
# Opt level: O0

VersionBitsTester * __thiscall VersionBitsTester::Reset(VersionBitsTester *this)

{
  TestConditionChecker *this_00;
  TestConditionChecker *pTVar1;
  reference ppCVar2;
  VersionBitsTester *in_RDI;
  long in_FS_OFFSET;
  uint i_1;
  uint i;
  TestConditionChecker *in_stack_fffffffffffffee8;
  value_type in_stack_fffffffffffffef0;
  uint local_f8;
  uint local_f4;
  undefined1 local_e8 [56];
  undefined1 local_b0 [56];
  undefined1 local_78 [56];
  undefined1 local_40 [56];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  in_RDI->num = (in_RDI->num - in_RDI->num % 1000) + 1000;
  local_f4 = 0;
  while( true ) {
    this_00 = (TestConditionChecker *)(ulong)local_f4;
    pTVar1 = (TestConditionChecker *)
             std::vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>::size
                       ((vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_> *)
                        in_stack_fffffffffffffee8);
    if (pTVar1 <= this_00) break;
    ppCVar2 = std::vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>::operator[]
                        ((vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_> *)this_00,
                         (size_type)in_stack_fffffffffffffef0);
    in_stack_fffffffffffffef0 = *ppCVar2;
    if (in_stack_fffffffffffffef0 != (value_type)0x0) {
      operator_delete(in_stack_fffffffffffffef0,0x98);
    }
    local_f4 = local_f4 + 1;
  }
  for (local_f8 = 0; local_f8 < 6; local_f8 = local_f8 + 1) {
    memset(local_40,0,0x38);
    TestConditionChecker::TestConditionChecker(in_stack_fffffffffffffee8);
    TestConditionChecker::operator=(this_00,(TestConditionChecker *)in_stack_fffffffffffffef0);
    TestConditionChecker::~TestConditionChecker(in_stack_fffffffffffffee8);
    memset(local_78,0,0x38);
    TestDelayedActivationConditionChecker::TestDelayedActivationConditionChecker
              ((TestDelayedActivationConditionChecker *)in_stack_fffffffffffffee8);
    TestDelayedActivationConditionChecker::operator=
              ((TestDelayedActivationConditionChecker *)this_00,
               (TestDelayedActivationConditionChecker *)in_stack_fffffffffffffef0);
    TestDelayedActivationConditionChecker::~TestDelayedActivationConditionChecker
              ((TestDelayedActivationConditionChecker *)in_stack_fffffffffffffee8);
    memset(local_b0,0,0x38);
    TestAlwaysActiveConditionChecker::TestAlwaysActiveConditionChecker
              ((TestAlwaysActiveConditionChecker *)in_stack_fffffffffffffee8);
    TestAlwaysActiveConditionChecker::operator=
              ((TestAlwaysActiveConditionChecker *)this_00,
               (TestAlwaysActiveConditionChecker *)in_stack_fffffffffffffef0);
    TestAlwaysActiveConditionChecker::~TestAlwaysActiveConditionChecker
              ((TestAlwaysActiveConditionChecker *)in_stack_fffffffffffffee8);
    memset(local_e8,0,0x38);
    TestNeverActiveConditionChecker::TestNeverActiveConditionChecker
              ((TestNeverActiveConditionChecker *)in_stack_fffffffffffffee8);
    TestNeverActiveConditionChecker::operator=
              ((TestNeverActiveConditionChecker *)this_00,
               (TestNeverActiveConditionChecker *)in_stack_fffffffffffffef0);
    TestNeverActiveConditionChecker::~TestNeverActiveConditionChecker
              ((TestNeverActiveConditionChecker *)in_stack_fffffffffffffee8);
  }
  std::vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>::clear
            ((vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_> *)in_stack_fffffffffffffee8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

VersionBitsTester& Reset() {
        // Have each group of tests be counted by the 1000s part, starting at 1000
        num = num - (num % 1000) + 1000;

        for (unsigned int i = 0; i < vpblock.size(); i++) {
            delete vpblock[i];
        }
        for (unsigned int  i = 0; i < CHECKERS; i++) {
            checker[i] = TestConditionChecker();
            checker_delayed[i] = TestDelayedActivationConditionChecker();
            checker_always[i] = TestAlwaysActiveConditionChecker();
            checker_never[i] = TestNeverActiveConditionChecker();
        }
        vpblock.clear();
        return *this;
    }